

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O0

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Mat *in_RSI;
  long in_RDI;
  int i_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size;
  int d;
  int h_1;
  int w_2;
  int j;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int h;
  int w_1;
  int i;
  float *ptr;
  int w;
  int dims;
  int local_c8;
  int in_stack_ffffffffffffff44;
  Mat *in_stack_ffffffffffffff48;
  Mat local_b0;
  float *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  float local_48;
  float local_44;
  float *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  float *local_28;
  int local_20;
  int local_1c;
  Mat *local_10;
  
  local_1c = in_RSI->dims;
  local_10 = in_RSI;
  if (local_1c == 1) {
    local_20 = in_RSI->w;
    local_28 = ncnn::Mat::operator_cast_to_float_(in_RSI);
    for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
      pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x240),(long)local_2c);
      fVar1 = *pfVar3;
      fVar2 = local_28[local_2c];
      pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1f8),(long)local_2c);
      local_28[local_2c] = fVar1 * fVar2 + *pfVar3;
    }
  }
  if (local_1c == 2) {
    local_30 = local_10->w;
    local_34 = local_10->h;
    for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
      local_40 = ncnn::Mat::row(local_10,local_38);
      pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1f8),(long)local_38);
      local_44 = *pfVar3;
      pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x240),(long)local_38);
      local_48 = *pfVar3;
      for (local_4c = 0; local_4c < local_30; local_4c = local_4c + 1) {
        local_40[local_4c] = local_48 * local_40[local_4c] + local_44;
      }
    }
  }
  if ((local_1c == 3) || (local_1c == 4)) {
    local_50 = local_10->w;
    local_54 = local_10->h;
    local_58 = local_10->d;
    local_5c = local_50 * local_54 * local_58;
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0xd0); local_60 = local_60 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_b0);
      ncnn::Mat::~Mat((Mat *)0x18c6cd);
      local_68 = pfVar3;
      pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1f8),(long)local_60);
      fVar1 = *pfVar3;
      pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x240),(long)local_60);
      fVar2 = *pfVar3;
      for (local_c8 = 0; local_c8 < local_5c; local_c8 = local_c8 + 1) {
        local_68[local_c8] = fVar2 * local_68[local_c8] + fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j = 0; j < w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i = 0; i < size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}